

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O3

uint8_t * icu_63::BytesTrie::findUniqueValueFromBranch
                    (uint8_t *pos,int32_t length,UBool haveUniqueValue,int32_t *uniqueValue)

{
  byte bVar1;
  UBool UVar2;
  int32_t iVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  int iVar6;
  
  puVar5 = pos;
  if (5 < length) {
    do {
      puVar4 = jumpByDelta(puVar5 + 1);
      puVar4 = findUniqueValueFromBranch(puVar4,(uint)length >> 1,haveUniqueValue,uniqueValue);
      if (puVar4 == (uint8_t *)0x0) {
        return (uint8_t *)0x0;
      }
      pos = puVar5 + 2;
      bVar1 = puVar5[1];
      if (0xbf < bVar1) {
        if (bVar1 < 0xf0) {
          pos = puVar5 + 3;
        }
        else if (bVar1 < 0xfe) {
          pos = puVar5 + 4;
        }
        else {
          pos = pos + (ulong)(bVar1 & 1) + 3;
        }
      }
      length = length - ((uint)length >> 1);
      puVar5 = pos;
    } while (5 < length);
  }
  iVar6 = length + 1;
  do {
    puVar5 = pos + 2;
    bVar1 = pos[1];
    iVar3 = readValue(puVar5,(uint)(bVar1 >> 1));
    if (0xa1 < bVar1) {
      if (bVar1 < 0xd8) {
        puVar5 = pos + 3;
      }
      else if (bVar1 < 0xfc) {
        puVar5 = pos + 4;
      }
      else {
        puVar5 = puVar5 + (ulong)(bVar1 >> 1 & 1) + 3;
      }
    }
    if ((bVar1 & 1) == 0) {
      UVar2 = findUniqueValue(puVar5 + iVar3,haveUniqueValue,uniqueValue);
      haveUniqueValue = '\x01';
      if (UVar2 == '\0') {
        return (uint8_t *)0x0;
      }
    }
    else if (haveUniqueValue == '\0') {
      *uniqueValue = iVar3;
      haveUniqueValue = '\x01';
    }
    else if (iVar3 != *uniqueValue) {
      return (uint8_t *)0x0;
    }
    iVar6 = iVar6 + -1;
    pos = puVar5;
  } while (2 < iVar6);
  return puVar5 + 1;
}

Assistant:

const uint8_t *
BytesTrie::findUniqueValueFromBranch(const uint8_t *pos, int32_t length,
                                     UBool haveUniqueValue, int32_t &uniqueValue) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison byte
        if(NULL==findUniqueValueFromBranch(jumpByDelta(pos), length>>1, haveUniqueValue, uniqueValue)) {
            return NULL;
        }
        length=length-(length>>1);
        pos=skipDelta(pos);
    }
    do {
        ++pos;  // ignore a comparison byte
        // handle its value
        int32_t node=*pos++;
        UBool isFinal=(UBool)(node&kValueIsFinal);
        int32_t value=readValue(pos, node>>1);
        pos=skipValue(pos, node);
        if(isFinal) {
            if(haveUniqueValue) {
                if(value!=uniqueValue) {
                    return NULL;
                }
            } else {
                uniqueValue=value;
                haveUniqueValue=TRUE;
            }
        } else {
            if(!findUniqueValue(pos+value, haveUniqueValue, uniqueValue)) {
                return NULL;
            }
            haveUniqueValue=TRUE;
        }
    } while(--length>1);
    return pos+1;  // ignore the last comparison byte
}